

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O2

bool __thiscall kratos::IRNode::has_attribute(IRNode *this,string *value_str)

{
  bool bVar1;
  __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
  __it;
  long lVar2;
  long lVar3;
  shared_ptr<kratos::Attribute> *psVar4;
  __normal_iterator<const_std::shared_ptr<kratos::Attribute>_*,_std::vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>_>
  _Var5;
  string *local_40;
  shared_ptr<kratos::Attribute> *local_38;
  
  __it._M_current =
       (this->attributes_).
       super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->attributes_).
             super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar2 = (long)local_38 - (long)__it._M_current;
  local_40 = value_str;
  for (lVar3 = lVar2 >> 6; psVar4 = local_38, 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it);
    psVar4 = local_38;
    _Var5._M_current = __it._M_current;
    if (bVar1) goto LAB_001af3e5;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it._M_current + 1);
    psVar4 = local_38;
    _Var5._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_001af3e5;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it._M_current + 2);
    psVar4 = local_38;
    _Var5._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_001af3e5;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it._M_current + 3);
    psVar4 = local_38;
    _Var5._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_001af3e5;
    __it._M_current = __it._M_current + 4;
    lVar2 = lVar2 + -0x40;
  }
  lVar2 = lVar2 >> 4;
  if (lVar2 != 1) {
    if (lVar2 != 2) {
      _Var5._M_current = psVar4;
      if ((lVar2 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
                  operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                              *)&local_40,__it), _Var5._M_current = __it._M_current, bVar1))
      goto LAB_001af3e5;
      __it._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it);
    _Var5._M_current = __it._M_current;
    if (bVar1) goto LAB_001af3e5;
    __it._M_current = __it._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::$_0>::
          operator()((_Iter_pred<kratos::IRNode::has_attribute(std::__cxx11::string_const&)const::__0>
                      *)&local_40,__it);
  _Var5._M_current = __it._M_current;
  if (!bVar1) {
    _Var5._M_current = psVar4;
  }
LAB_001af3e5:
  return _Var5._M_current != psVar4;
}

Assistant:

bool IRNode::has_attribute(const std::string &value_str) const {
    return std::any_of(attributes_.begin(), attributes_.end(),
                       [&](auto const &attr) { return attr->value_str == value_str; });
}